

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

bool __thiscall glcts::anon_unknown_0::VertexBindingState::stateVerify(VertexBindingState *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  GLint p;
  GLint64 p64;
  int local_2c;
  long local_28;
  
  this_00 = &(this->super_GLWrapper).super_CallLogWrapper;
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x8f4f,this->index,&local_2c);
  bVar1 = local_2c == this->buffer;
  if (!bVar1) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_BUFFER(%d) is %d should be %d.\n",(ulong)(uint)this->index);
  }
  glu::CallLogWrapper::glGetInteger64i_v(this_00,0x82d7,this->index,&local_28);
  bVar2 = local_28 == this->offset;
  if (!bVar2) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_OFFSET(%d) is %ld should be %ld.\n",(ulong)(uint)this->index);
  }
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x82d8,this->index,&local_2c);
  bVar3 = local_2c == this->stride;
  if (!bVar3) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_STRIDE(%d) is %d should be %d.\n",(ulong)(uint)this->index);
  }
  glu::CallLogWrapper::glGetIntegeri_v(this_00,0x82d6,this->index,&local_2c);
  bVar4 = local_2c == this->divisor;
  if (!bVar4) {
    anon_unknown_0::Output
              ("GL_VERTEX_BINDING_DIVISOR(%d) is %d should be %d.\n",(ulong)(uint)this->index);
  }
  return bVar4 && (bVar3 && (bVar2 && bVar1));
}

Assistant:

bool stateVerify()
	{
		bool  status = true;
		GLint p;
		glGetIntegeri_v(GL_VERTEX_BINDING_BUFFER, index, &p);
		if (p != buffer)
		{
			Output("GL_VERTEX_BINDING_BUFFER(%d) is %d should be %d.\n", index, p, buffer);
			status = false;
		}
		GLint64 p64;
		glGetInteger64i_v(GL_VERTEX_BINDING_OFFSET, index, &p64);
		if (p64 != offset)
		{
			Output("GL_VERTEX_BINDING_OFFSET(%d) is %ld should be %ld.\n", index, p64, offset);
			status = false;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_STRIDE, index, &p);
		if (p != stride)
		{
			Output("GL_VERTEX_BINDING_STRIDE(%d) is %d should be %d.\n", index, p, stride);
			status = false;
		}
		glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, index, &p);
		if (p != divisor)
		{
			Output("GL_VERTEX_BINDING_DIVISOR(%d) is %d should be %d.\n", index, p, divisor);
			status = false;
		}
		return status;
	}